

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_sign.c
# Opt level: O1

int crypto_sign_open(uchar *m,unsigned_long_long *mlen,uchar *sm,unsigned_long_long smlen,uchar *pk)

{
  int iVar1;
  size_t __n;
  ulong uVar2;
  picnic_publickey_t ppk;
  undefined1 local_71 [65];
  
  iVar1 = -3;
  if ((((*pk == '\x06') && (iVar1 = -2, 3 < smlen)) &&
      (uVar2 = (ulong)*(uint *)sm, uVar2 + 4 <= smlen)) &&
     (iVar1 = picnic_read_public_key(local_71,pk,0x41), -1 < iVar1)) {
    __n = (smlen - uVar2) - 4;
    iVar1 = picnic_verify(local_71,sm + 4,__n,sm + (smlen - uVar2),uVar2);
    if (iVar1 == 0) {
      memmove(m,sm + 4,__n);
      *mlen = __n;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int crypto_sign_open(unsigned char* m, unsigned long long* mlen, const unsigned char* sm,
                     unsigned long long smlen, const unsigned char* pk) {
  if (pk[0] != Picnic_L5_UR) {
    return -3;
  }

  uint32_t signature_len = 0;
  // The signature is too short to hold the signature length.
  if (smlen < sizeof(signature_len)) {
    return -2;
  }

  memcpy(&signature_len, sm, sizeof(signature_len));
  signature_len = le32toh(signature_len);
  // The signature is too short to hold the signature
  if (signature_len + sizeof(signature_len) > smlen) {
    return -2;
  }

  picnic_publickey_t ppk;
  int ret = picnic_read_public_key(&ppk, pk, PICNIC_PUBLIC_KEY_SIZE(Picnic_L5_UR));
  if (ret < 0) {
    return ret;
  }

  const size_t message_len = smlen - signature_len - sizeof(signature_len);
  const uint8_t* message   = sm + sizeof(signature_len);
  const uint8_t* sig       = sm + sizeof(signature_len) + message_len;

  ret = picnic_verify(&ppk, message, message_len, sig, signature_len);
  if (ret) {
    return ret;
  }

  // The signature is valid, so copy the message to its destination.
  memmove(m, message, message_len);
  *mlen = message_len;

  return 0;
}